

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

bool __thiscall QCommandLineParser::isSet(QCommandLineParser *this,QString *name)

{
  bool bVar1;
  undefined1 uVar2;
  const_iterator o;
  QString *str;
  QCommandLineParserPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *optionName;
  add_const_t<QList<QString>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList aliases;
  QCommandLineParserPrivate *in_stack_ffffffffffffff58;
  QList<QString> *in_stack_ffffffffffffff60;
  CaseSensitivity in_stack_ffffffffffffff6c;
  QString *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  bool local_39;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCommandLineParserPrivate::checkParsed(in_stack_ffffffffffffff58,(char *)0x6f1bef);
  bVar1 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  if (bVar1) {
    local_39 = true;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QCommandLineParserPrivate::aliases
              (in_RDI,(QString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    local_28.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QString>::begin(in_stack_ffffffffffffff60);
    o = QList<QString>::end(in_stack_ffffffffffffff60);
    while( true ) {
      uVar2 = QList<QString>::const_iterator::operator!=(&local_28,o);
      if (!(bool)uVar2) break;
      str = QList<QString>::const_iterator::operator*(&local_28);
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)CONCAT17(uVar2,in_stack_ffffffffffffff78),
                         str,in_stack_ffffffffffffff6c);
      if (bVar1) {
        local_39 = true;
        goto LAB_006f1d89;
      }
      QList<QString>::const_iterator::operator++(&local_28);
    }
    local_39 = false;
LAB_006f1d89:
    QList<QString>::~QList((QList<QString> *)0x6f1d96);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParser::isSet(const QString &name) const
{
    d->checkParsed("isSet");
    if (d->optionNames.contains(name))
        return true;
    const QStringList aliases = d->aliases(name);
    for (const QString &optionName : std::as_const(d->optionNames)) {
        if (aliases.contains(optionName))
            return true;
    }
    return false;
}